

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtHashMap.h
# Opt level: O1

void __thiscall
cbtHashMap<cbtInternalVertexPair,_cbtInternalEdge>::insert
          (cbtHashMap<cbtInternalVertexPair,_cbtInternalEdge> *this,cbtInternalVertexPair *key,
          cbtInternalEdge *value)

{
  short sVar1;
  short sVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  cbtInternalEdge *ptr;
  cbtInternalVertexPair *ptr_00;
  int *piVar6;
  int iVar7;
  cbtInternalEdge *pcVar8;
  long lVar9;
  cbtInternalVertexPair *pcVar10;
  long lVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  
  sVar1 = key->m_v0;
  sVar2 = key->m_v1;
  iVar3 = (this->m_valueArray).m_capacity;
  iVar7 = findIndex(this,key);
  if (iVar7 == -1) {
    iVar7 = (this->m_valueArray).m_size;
    iVar4 = (this->m_valueArray).m_capacity;
    if (iVar7 == iVar4) {
      iVar14 = 1;
      if (iVar7 != 0) {
        iVar14 = iVar7 * 2;
      }
      if (iVar4 < iVar14) {
        if (iVar14 == 0) {
          pcVar8 = (cbtInternalEdge *)0x0;
        }
        else {
          pcVar8 = (cbtInternalEdge *)cbtAlignedAllocInternal((long)iVar14 << 2,0x10);
        }
        lVar9 = (long)(this->m_valueArray).m_size;
        if (0 < lVar9) {
          lVar11 = 0;
          do {
            pcVar8[lVar11] = (this->m_valueArray).m_data[lVar11];
            lVar11 = lVar11 + 1;
          } while (lVar9 != lVar11);
        }
        ptr = (this->m_valueArray).m_data;
        if (ptr != (cbtInternalEdge *)0x0) {
          if ((this->m_valueArray).m_ownsMemory == true) {
            cbtAlignedFreeInternal(ptr);
          }
          (this->m_valueArray).m_data = (cbtInternalEdge *)0x0;
        }
        (this->m_valueArray).m_ownsMemory = true;
        (this->m_valueArray).m_data = pcVar8;
        (this->m_valueArray).m_capacity = iVar14;
      }
    }
    (this->m_valueArray).m_data[(this->m_valueArray).m_size] = *value;
    piVar6 = &(this->m_valueArray).m_size;
    *piVar6 = *piVar6 + 1;
    iVar14 = (this->m_keyArray).m_size;
    iVar5 = (this->m_keyArray).m_capacity;
    if (iVar14 == iVar5) {
      iVar13 = 1;
      if (iVar14 != 0) {
        iVar13 = iVar14 * 2;
      }
      if (iVar5 < iVar13) {
        if (iVar13 == 0) {
          pcVar10 = (cbtInternalVertexPair *)0x0;
        }
        else {
          pcVar10 = (cbtInternalVertexPair *)cbtAlignedAllocInternal((long)iVar13 << 2,0x10);
        }
        lVar9 = (long)(this->m_keyArray).m_size;
        if (0 < lVar9) {
          lVar11 = 0;
          do {
            pcVar10[lVar11] = (this->m_keyArray).m_data[lVar11];
            lVar11 = lVar11 + 1;
          } while (lVar9 != lVar11);
        }
        ptr_00 = (this->m_keyArray).m_data;
        if (ptr_00 != (cbtInternalVertexPair *)0x0) {
          if ((this->m_keyArray).m_ownsMemory == true) {
            cbtAlignedFreeInternal(ptr_00);
          }
          (this->m_keyArray).m_data = (cbtInternalVertexPair *)0x0;
        }
        (this->m_keyArray).m_ownsMemory = true;
        (this->m_keyArray).m_data = pcVar10;
        (this->m_keyArray).m_capacity = iVar13;
      }
    }
    (this->m_keyArray).m_data[(this->m_keyArray).m_size] = *key;
    piVar6 = &(this->m_keyArray).m_size;
    *piVar6 = *piVar6 + 1;
    if (iVar4 < (this->m_valueArray).m_capacity) {
      growTables(this,key);
      uVar12 = (this->m_valueArray).m_capacity - 1U &
               (uint)(ushort)key->m_v1 * 0x10000 + (int)key->m_v0;
    }
    else {
      uVar12 = iVar3 - 1U & sVar2 * 0x10000 + (int)sVar1;
    }
    piVar6 = (this->m_hashTable).m_data;
    (this->m_next).m_data[iVar7] = piVar6[(int)uVar12];
    piVar6[(int)uVar12] = iVar7;
  }
  else {
    (this->m_valueArray).m_data[iVar7] = *value;
  }
  return;
}

Assistant:

void insert(const Key& key, const Value& value)
	{
		int hash = key.getHash() & (m_valueArray.capacity() - 1);

		//replace value if the key is already there
		int index = findIndex(key);
		if (index != BT_HASH_NULL)
		{
			m_valueArray[index] = value;
			return;
		}

		int count = m_valueArray.size();
		int oldCapacity = m_valueArray.capacity();
		m_valueArray.push_back(value);
		m_keyArray.push_back(key);

		int newCapacity = m_valueArray.capacity();
		if (oldCapacity < newCapacity)
		{
			growTables(key);
			//hash with new capacity
			hash = key.getHash() & (m_valueArray.capacity() - 1);
		}
		m_next[count] = m_hashTable[hash];
		m_hashTable[hash] = count;
	}